

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O0

iterator __thiscall
QMultiMap<QByteArray,_QByteArray>::insert
          (QMultiMap<QByteArray,_QByteArray> *this,QByteArray *key,QByteArray *value)

{
  bool bVar1;
  QMapData<std::multimap<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>
  *pQVar2;
  pair<const_QByteArray,_QByteArray> *in_RDI;
  long in_FS_OFFSET;
  iterator i;
  QMultiMap<QByteArray,_QByteArray> copy;
  multimap<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>
  *in_stack_ffffffffffffff68;
  iterator it;
  QMultiMap<QByteArray,_QByteArray> *in_stack_ffffffffffffff70;
  pair<const_QByteArray,_QByteArray> *this_00;
  QByteArray *in_stack_ffffffffffffff78;
  const_iterator in_stack_ffffffffffffff88;
  pair<const_QByteArray,_QByteArray> local_58;
  _Rb_tree_const_iterator<std::pair<const_QByteArray,_QByteArray>_> local_28;
  iterator local_20;
  undefined8 local_18;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = 0xaaaaaaaaaaaaaaaa;
  bVar1 = QtPrivate::
          QExplicitlySharedDataPointerV2<QMapData<std::multimap<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>_>
          ::isShared(&in_stack_ffffffffffffff70->d);
  if (bVar1) {
    QMultiMap(in_stack_ffffffffffffff70,
              (QMultiMap<QByteArray,_QByteArray> *)in_stack_ffffffffffffff68);
  }
  else {
    memset(&local_18,0,8);
    QMultiMap((QMultiMap<QByteArray,_QByteArray> *)0x1cecb4);
  }
  detach(in_stack_ffffffffffffff70);
  local_20._M_node = (_Base_ptr)0xaaaaaaaaaaaaaaaa;
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::multimap<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>_>
  ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::multimap<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>_>
                *)0x1cecd7);
  local_20._M_node =
       (_Base_ptr)
       std::
       multimap<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>
       ::lower_bound(in_stack_ffffffffffffff68,(key_type *)0x1cece8);
  pQVar2 = QtPrivate::
           QExplicitlySharedDataPointerV2<QMapData<std::multimap<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>_>
           ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::multimap<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>_>
                         *)0x1cecf7);
  it._M_node = (_Base_ptr)&pQVar2->m;
  std::_Rb_tree_const_iterator<std::pair<const_QByteArray,_QByteArray>_>::_Rb_tree_const_iterator
            (&local_28,&local_20);
  this_00 = &local_58;
  std::pair<const_QByteArray,_QByteArray>::pair<const_QByteArray,_QByteArray,_true>
            (in_RDI,in_stack_ffffffffffffff78,&this_00->first);
  std::
  multimap<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>
  ::insert((multimap<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>
            *)this_00,in_stack_ffffffffffffff88,(value_type *)it._M_node);
  iterator::iterator((iterator *)0x1ced51,it);
  std::pair<const_QByteArray,_QByteArray>::~pair(this_00);
  ~QMultiMap((QMultiMap<QByteArray,_QByteArray> *)0x1ced68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)(iterator)local_10._M_node;
  }
  __stack_chk_fail();
}

Assistant:

iterator insert(const Key &key, const T &value)
    {
        const auto copy = d.isShared() ? *this : QMultiMap(); // keep `key`/`value` alive across the detach
        detach();
        // note that std::multimap inserts at the end of an equal_range for a key,
        // QMultiMap at the beginning.
        auto i = d->m.lower_bound(key);
        return iterator(d->m.insert(i, {key, value}));
    }